

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixShmLock(sqlite3_file *fd,int ofst,int n,int flags)

{
  ushort *puVar1;
  sqlite3_io_methods *psVar2;
  long lVar3;
  sqlite3_io_methods *psVar4;
  long lVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  ushort uVar9;
  uint uVar10;
  bool bVar11;
  
  psVar2 = fd[8].pMethods;
  lVar3 = *(long *)psVar2;
  if (*(sqlite3_mutex **)(lVar3 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar3 + 8));
  }
  uVar10 = (1 << ((char)n + (byte)ofst & 0x1f)) + (-1 << ((byte)ofst & 0x1f));
  uVar9 = (ushort)uVar10;
  if ((flags & 1U) == 0) {
    lVar5 = *(long *)(lVar3 + 0x38);
    bVar11 = lVar5 == 0;
    if ((flags & 4U) == 0) {
      iVar8 = 0;
      if (lVar5 != 0) {
        do {
          if (((uVar10 & *(ushort *)(lVar5 + 0x14)) != 0) ||
             ((uVar10 & *(ushort *)(lVar5 + 0x12)) != 0)) {
            iVar8 = 5;
            break;
          }
          lVar5 = *(long *)(lVar5 + 8);
          bVar11 = lVar5 == 0;
        } while (!bVar11);
      }
      if (bVar11) {
        uVar10 = *(uint *)((fd[2].pMethods)->xLock + 0x18);
        if ((int)uVar10 < 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = (*aSyscall[7].pCurrent)((ulong)uVar10,6);
          iVar8 = (uint)(iVar8 == -1) * 5;
        }
        if (iVar8 == 0) {
          puVar1 = (ushort *)((long)&psVar2->xRead + 4);
          *puVar1 = *puVar1 | uVar9;
          iVar8 = 0;
        }
      }
    }
    else {
      uVar7 = 0;
      if (lVar5 == 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = 5;
        uVar7 = 0;
        if ((uVar10 & *(ushort *)(lVar5 + 0x14)) == 0) {
          iVar8 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 | *(ushort *)(lVar5 + 0x12);
            lVar5 = *(long *)(lVar5 + 8);
            bVar11 = lVar5 == 0;
            if (bVar11) goto LAB_00147593;
          } while ((uVar10 & *(ushort *)(lVar5 + 0x14)) == 0);
          iVar8 = 5;
LAB_00147593:
          uVar7 = (uint)uVar6;
        }
      }
      if ((bVar11) && (iVar8 = 0, (uVar10 & uVar7) == 0)) {
        uVar10 = *(uint *)((fd[2].pMethods)->xLock + 0x18);
        if ((int)uVar10 < 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = (*aSyscall[7].pCurrent)((ulong)uVar10,6);
          iVar8 = (uint)(iVar8 == -1) * 5;
        }
      }
      if (iVar8 == 0) {
        puVar1 = (ushort *)((long)&psVar2->xRead + 2);
        *puVar1 = *puVar1 | uVar9;
      }
    }
  }
  else {
    psVar4 = *(sqlite3_io_methods **)(lVar3 + 0x38);
    iVar8 = 0;
    uVar7 = 0;
    if (psVar4 != (sqlite3_io_methods *)0x0) {
      uVar6 = 0;
      do {
        if (psVar4 != psVar2) {
          uVar6 = uVar6 | *(ushort *)((long)&psVar4->xRead + 2);
        }
        psVar4 = (sqlite3_io_methods *)psVar4->xClose;
      } while (psVar4 != (sqlite3_io_methods *)0x0);
      uVar7 = (uint)uVar6;
    }
    if ((uVar10 & uVar7) == 0) {
      uVar10 = *(uint *)((fd[2].pMethods)->xLock + 0x18);
      if ((int)uVar10 < 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = (*aSyscall[7].pCurrent)((ulong)uVar10,6);
        iVar8 = (uint)(iVar8 == -1) * 5;
      }
    }
    if (iVar8 == 0) {
      puVar1 = (ushort *)((long)&psVar2->xRead + 4);
      *puVar1 = *puVar1 & ~uVar9;
      puVar1 = (ushort *)((long)&psVar2->xRead + 2);
      *puVar1 = *puVar1 & ~uVar9;
    }
  }
  if (*(sqlite3_mutex **)(lVar3 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar3 + 8));
  }
  return iVar8;
}

Assistant:

static int unixShmLock(
  sqlite3_file *fd,          /* Database file holding the shared memory */
  int ofst,                  /* First lock to acquire or release */
  int n,                     /* Number of locks to acquire or release */
  int flags                  /* What to do with the lock */
){
  unixFile *pDbFd = (unixFile*)fd;      /* Connection holding shared memory */
  unixShm *p = pDbFd->pShm;             /* The shared memory being locked */
  unixShm *pX;                          /* For looping over all siblings */
  unixShmNode *pShmNode = p->pShmNode;  /* The underlying file iNode */
  int rc = SQLITE_OK;                   /* Result code */
  u16 mask;                             /* Mask of locks to take or release */

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( ofst>=0 && ofst+n<=SQLITE_SHM_NLOCK );
  assert( n>=1 );
  assert( flags==(SQLITE_SHM_LOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_LOCK | SQLITE_SHM_EXCLUSIVE)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_SHARED)
       || flags==(SQLITE_SHM_UNLOCK | SQLITE_SHM_EXCLUSIVE) );
  assert( n==1 || (flags & SQLITE_SHM_EXCLUSIVE)!=0 );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  mask = (1<<(ofst+n)) - (1<<ofst);
  assert( n>1 || mask==(1<<ofst) );
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( flags & SQLITE_SHM_UNLOCK ){
    u16 allMask = 0; /* Mask of locks held by siblings */

    /* See if any siblings hold this same lock */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( pX==p ) continue;
      assert( (pX->exclMask & (p->exclMask|p->sharedMask))==0 );
      allMask |= pX->sharedMask;
    }

    /* Unlock the system-level locks */
    if( (mask & allMask)==0 ){
      rc = unixShmSystemLock(pDbFd, F_UNLCK, ofst+UNIX_SHM_BASE, n);
    }else{
      rc = SQLITE_OK;
    }

    /* Undo the local locks */
    if( rc==SQLITE_OK ){
      p->exclMask &= ~mask;
      p->sharedMask &= ~mask;
    } 
  }else if( flags & SQLITE_SHM_SHARED ){
    u16 allShared = 0;  /* Union of locks held by connections other than "p" */

    /* Find out which shared locks are already held by sibling connections.
    ** If any sibling already holds an exclusive lock, go ahead and return
    ** SQLITE_BUSY.
    */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( (pX->exclMask & mask)!=0 ){
        rc = SQLITE_BUSY;
        break;
      }
      allShared |= pX->sharedMask;
    }

    /* Get shared locks at the system level, if necessary */
    if( rc==SQLITE_OK ){
      if( (allShared & mask)==0 ){
        rc = unixShmSystemLock(pDbFd, F_RDLCK, ofst+UNIX_SHM_BASE, n);
      }else{
        rc = SQLITE_OK;
      }
    }

    /* Get the local shared locks */
    if( rc==SQLITE_OK ){
      p->sharedMask |= mask;
    }
  }else{
    /* Make sure no sibling connections hold locks that will block this
    ** lock.  If any do, return SQLITE_BUSY right away.
    */
    for(pX=pShmNode->pFirst; pX; pX=pX->pNext){
      if( (pX->exclMask & mask)!=0 || (pX->sharedMask & mask)!=0 ){
        rc = SQLITE_BUSY;
        break;
      }
    }
  
    /* Get the exclusive locks at the system level.  Then if successful
    ** also mark the local connection as being locked.
    */
    if( rc==SQLITE_OK ){
      rc = unixShmSystemLock(pDbFd, F_WRLCK, ofst+UNIX_SHM_BASE, n);
      if( rc==SQLITE_OK ){
        assert( (p->sharedMask & mask)==0 );
        p->exclMask |= mask;
      }
    }
  }
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  OSTRACE(("SHM-LOCK shmid-%d, pid-%d got %03x,%03x\n",
           p->id, osGetpid(0), p->sharedMask, p->exclMask));
  return rc;
}